

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::BNLL_x86_avx::forward_inplace(BNLL_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  long lVar6;
  undefined1 (*pauVar7) [32];
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar18 [16];
  float fVar17;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar32;
  float fVar33;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  float fVar34;
  undefined1 auVar31 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  
  iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar12 = 0;
  uVar11 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar11 = uVar12;
  }
  auVar50 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pauVar7 = (undefined1 (*) [32])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
    lVar10 = 0;
    for (iVar9 = 0; auVar42 = auVar50._0_16_, iVar9 + 7 < iVar8; iVar9 = iVar9 + 8) {
      auVar15._8_4_ = 0x80000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar15._12_4_ = 0x80000000;
      auVar15._16_4_ = 0x80000000;
      auVar15._20_4_ = 0x80000000;
      auVar15._24_4_ = 0x80000000;
      auVar15._28_4_ = 0x80000000;
      auVar15 = vorps_avx(*pauVar7,auVar15);
      auVar25._8_4_ = 0x42b0c0a5;
      auVar25._0_8_ = 0x42b0c0a542b0c0a5;
      auVar25._12_4_ = 0x42b0c0a5;
      auVar25._16_4_ = 0x42b0c0a5;
      auVar25._20_4_ = 0x42b0c0a5;
      auVar25._24_4_ = 0x42b0c0a5;
      auVar25._28_4_ = 0x42b0c0a5;
      auVar15 = vminps_avx(auVar15,auVar25);
      auVar26._8_4_ = 0xc2b0c0a5;
      auVar26._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar26._12_4_ = 0xc2b0c0a5;
      auVar26._16_4_ = 0xc2b0c0a5;
      auVar26._20_4_ = 0xc2b0c0a5;
      auVar26._24_4_ = 0xc2b0c0a5;
      auVar26._28_4_ = 0xc2b0c0a5;
      auVar25 = vmaxps_avx(auVar15,auVar26);
      auVar47._8_4_ = 0x3f000000;
      auVar47._0_8_ = 0x3f0000003f000000;
      auVar47._12_4_ = 0x3f000000;
      auVar47._16_4_ = 0x3f000000;
      auVar47._20_4_ = 0x3f000000;
      auVar47._24_4_ = 0x3f000000;
      auVar47._28_4_ = 0x3f000000;
      auVar27._0_4_ = auVar25._0_4_ * 1.442695 + 0.5;
      auVar27._4_4_ = auVar25._4_4_ * 1.442695 + 0.5;
      auVar27._8_4_ = auVar25._8_4_ * 1.442695 + 0.5;
      auVar27._12_4_ = auVar25._12_4_ * 1.442695 + 0.5;
      auVar27._16_4_ = auVar25._16_4_ * 1.442695 + 0.5;
      auVar27._20_4_ = auVar25._20_4_ * 1.442695 + 0.5;
      auVar27._24_4_ = auVar25._24_4_ * 1.442695 + 0.5;
      auVar27._28_4_ = 0x3ff8aa3b;
      auVar26 = vroundps_avx(auVar27,1);
      auVar15 = vcmpps_avx(auVar27,auVar26,1);
      auVar49._8_4_ = 0x3f800000;
      auVar49._0_8_ = 0x3f8000003f800000;
      auVar49._12_4_ = 0x3f800000;
      auVar49._16_4_ = 0x3f800000;
      auVar49._20_4_ = 0x3f800000;
      auVar49._24_4_ = 0x3f800000;
      auVar49._28_4_ = 0x3f800000;
      auVar15 = vandps_avx(auVar15,auVar49);
      auVar15 = vsubps_avx(auVar26,auVar15);
      auVar5._4_4_ = auVar15._4_4_ * 0.6931472;
      auVar5._0_4_ = auVar15._0_4_ * 0.6931472;
      auVar5._8_4_ = auVar15._8_4_ * 0.6931472;
      auVar5._12_4_ = auVar15._12_4_ * 0.6931472;
      auVar5._16_4_ = auVar15._16_4_ * 0.6931472;
      auVar5._20_4_ = auVar15._20_4_ * 0.6931472;
      auVar5._24_4_ = auVar15._24_4_ * 0.6931472;
      auVar5._28_4_ = auVar26._28_4_;
      auVar25 = vsubps_avx(auVar25,auVar5);
      fVar17 = auVar25._0_4_;
      fVar32 = auVar25._4_4_;
      fVar33 = auVar25._8_4_;
      fVar34 = auVar25._12_4_;
      fVar35 = auVar25._16_4_;
      fVar36 = auVar25._20_4_;
      fVar37 = auVar25._24_4_;
      auVar18._0_4_ = (int)auVar15._0_4_;
      auVar18._4_4_ = (int)auVar15._4_4_;
      auVar18._8_4_ = (int)auVar15._8_4_;
      auVar18._12_4_ = (int)auVar15._12_4_;
      auVar28._16_4_ = (int)auVar15._16_4_;
      auVar28._0_16_ = auVar18;
      auVar28._20_4_ = (int)auVar15._20_4_;
      auVar28._24_4_ = (int)auVar15._24_4_;
      auVar28._28_4_ = (int)auVar15._28_4_;
      auVar38 = vpslld_avx(auVar18,0x17);
      auVar18 = vpslld_avx(auVar28._16_16_,0x17);
      auVar18 = vpaddd_avx(auVar42,auVar18);
      auVar42 = vpaddd_avx(auVar42,auVar38);
      auVar16._0_4_ =
           (fVar17 + 1.0 +
           fVar17 * fVar17 *
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar42._0_4_ + 1.0;
      auVar16._4_4_ =
           (fVar32 + 1.0 +
           fVar32 * fVar32 *
           (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
             0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5)) * auVar42._4_4_ + 1.0;
      auVar16._8_4_ =
           (fVar33 + 1.0 +
           fVar33 * fVar33 *
           (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
             0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar42._8_4_ + 1.0;
      auVar16._12_4_ =
           (fVar34 + 1.0 +
           fVar34 * fVar34 *
           (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
             0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar42._12_4_ + 1.0;
      auVar16._16_4_ =
           (fVar35 + 1.0 +
           fVar35 * fVar35 *
           (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
             0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar18._0_4_ + 1.0;
      auVar16._20_4_ =
           (fVar36 + 1.0 +
           fVar36 * fVar36 *
           (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
             0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar18._4_4_ + 1.0;
      auVar16._24_4_ =
           (fVar37 + 1.0 +
           fVar37 * fVar37 *
           (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
             0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar18._8_4_ + 1.0;
      auVar16._28_4_ = auVar25._28_4_ + 1.0 + auVar26._28_4_ + 1.0;
      auVar29._8_4_ = 0x800000;
      auVar29._0_8_ = 0x80000000800000;
      auVar29._12_4_ = 0x800000;
      auVar29._16_4_ = 0x800000;
      auVar29._20_4_ = 0x800000;
      auVar29._24_4_ = 0x800000;
      auVar29._28_4_ = 0x800000;
      auVar26 = vmaxps_avx(auVar16,auVar29);
      auVar42 = vpsrld_avx(auVar26._16_16_,0x17);
      auVar30._8_4_ = 0x807fffff;
      auVar30._0_8_ = 0x807fffff807fffff;
      auVar30._12_4_ = 0x807fffff;
      auVar30._16_4_ = 0x807fffff;
      auVar30._20_4_ = 0x807fffff;
      auVar30._24_4_ = 0x807fffff;
      auVar30._28_4_ = 0x807fffff;
      auVar15 = vandps_avx(auVar26,auVar30);
      auVar5 = vorps_avx(auVar15,auVar47);
      auVar48._8_4_ = 0x3f3504f3;
      auVar48._0_8_ = 0x3f3504f33f3504f3;
      auVar48._12_4_ = 0x3f3504f3;
      auVar48._16_4_ = 0x3f3504f3;
      auVar48._20_4_ = 0x3f3504f3;
      auVar48._24_4_ = 0x3f3504f3;
      auVar48._28_4_ = 0x3f3504f3;
      auVar25 = vcmpps_avx(auVar48,auVar5,2);
      auVar15 = vandnps_avx(auVar25,auVar5);
      fVar17 = auVar5._0_4_ + -1.0 + auVar15._0_4_;
      fVar32 = auVar5._4_4_ + -1.0 + auVar15._4_4_;
      fVar33 = auVar5._8_4_ + -1.0 + auVar15._8_4_;
      fVar34 = auVar5._12_4_ + -1.0 + auVar15._12_4_;
      fVar35 = auVar5._16_4_ + -1.0 + auVar15._16_4_;
      fVar36 = auVar5._20_4_ + -1.0 + auVar15._20_4_;
      fVar37 = auVar5._24_4_ + -1.0 + auVar15._24_4_;
      auVar42 = vpsubd_avx(auVar42,auVar25._16_16_);
      auVar18 = vpsrld_avx(auVar26._0_16_,0x17);
      auVar38._8_4_ = 0xffffff81;
      auVar38._0_8_ = 0xffffff81ffffff81;
      auVar38._12_4_ = 0xffffff81;
      auVar42 = vpaddd_avx(auVar42,auVar38);
      auVar18 = vpsubd_avx(auVar18,auVar25._0_16_);
      auVar18 = vpaddd_avx(auVar18,auVar38);
      auVar41._16_16_ = auVar42;
      auVar41._0_16_ = auVar18;
      auVar25 = vcvtdq2ps_avx(auVar41);
      auVar31._0_4_ =
           auVar25._0_4_ * 0.6931472 + fVar17 +
           fVar17 * fVar17 *
           (((((((((fVar17 * 0.070376836 + -0.1151461) * fVar17 + 0.116769984) * fVar17 +
                 -0.12420141) * fVar17 + 0.14249323) * fVar17 + -0.16668057) * fVar17 + 0.20000714)
              * fVar17 + -0.24999994) * fVar17 + 0.3333333) * fVar17 + -0.5);
      auVar31._4_4_ =
           auVar25._4_4_ * 0.6931472 + fVar32 +
           fVar32 * fVar32 *
           (((((((((fVar32 * 0.070376836 + -0.1151461) * fVar32 + 0.116769984) * fVar32 +
                 -0.12420141) * fVar32 + 0.14249323) * fVar32 + -0.16668057) * fVar32 + 0.20000714)
              * fVar32 + -0.24999994) * fVar32 + 0.3333333) * fVar32 + -0.5);
      auVar31._8_4_ =
           auVar25._8_4_ * 0.6931472 + fVar33 +
           fVar33 * fVar33 *
           (((((((((fVar33 * 0.070376836 + -0.1151461) * fVar33 + 0.116769984) * fVar33 +
                 -0.12420141) * fVar33 + 0.14249323) * fVar33 + -0.16668057) * fVar33 + 0.20000714)
              * fVar33 + -0.24999994) * fVar33 + 0.3333333) * fVar33 + -0.5);
      auVar31._12_4_ =
           auVar25._12_4_ * 0.6931472 + fVar34 +
           fVar34 * fVar34 *
           (((((((((fVar34 * 0.070376836 + -0.1151461) * fVar34 + 0.116769984) * fVar34 +
                 -0.12420141) * fVar34 + 0.14249323) * fVar34 + -0.16668057) * fVar34 + 0.20000714)
              * fVar34 + -0.24999994) * fVar34 + 0.3333333) * fVar34 + -0.5);
      auVar31._16_4_ =
           auVar25._16_4_ * 0.6931472 + fVar35 +
           fVar35 * fVar35 *
           (((((((((fVar35 * 0.070376836 + -0.1151461) * fVar35 + 0.116769984) * fVar35 +
                 -0.12420141) * fVar35 + 0.14249323) * fVar35 + -0.16668057) * fVar35 + 0.20000714)
              * fVar35 + -0.24999994) * fVar35 + 0.3333333) * fVar35 + -0.5);
      auVar31._20_4_ =
           auVar25._20_4_ * 0.6931472 + fVar36 +
           fVar36 * fVar36 *
           (((((((((fVar36 * 0.070376836 + -0.1151461) * fVar36 + 0.116769984) * fVar36 +
                 -0.12420141) * fVar36 + 0.14249323) * fVar36 + -0.16668057) * fVar36 + 0.20000714)
              * fVar36 + -0.24999994) * fVar36 + 0.3333333) * fVar36 + -0.5);
      auVar31._24_4_ =
           auVar25._24_4_ * 0.6931472 + fVar37 +
           fVar37 * fVar37 *
           (((((((((fVar37 * 0.070376836 + -0.1151461) * fVar37 + 0.116769984) * fVar37 +
                 -0.12420141) * fVar37 + 0.14249323) * fVar37 + -0.16668057) * fVar37 + 0.20000714)
              * fVar37 + -0.24999994) * fVar37 + 0.3333333) * fVar37 + -0.5);
      auVar31._28_4_ = auVar25._28_4_ + auVar5._28_4_ + -1.0 + auVar15._28_4_ + 0.0;
      auVar15 = vcmpps_avx(auVar16,ZEXT1232(ZEXT412(0)) << 0x20,2);
      auVar25 = vorps_avx(auVar15,auVar31);
      auVar15 = vmaxps_avx(*pauVar7,ZEXT1232(ZEXT412(0)) << 0x20);
      *(float *)*pauVar7 = auVar25._0_4_ + auVar15._0_4_;
      *(float *)(*pauVar7 + 4) = auVar25._4_4_ + auVar15._4_4_;
      *(float *)(*pauVar7 + 8) = auVar25._8_4_ + auVar15._8_4_;
      *(float *)(*pauVar7 + 0xc) = auVar25._12_4_ + auVar15._12_4_;
      *(float *)(*pauVar7 + 0x10) = auVar25._16_4_ + auVar15._16_4_;
      *(float *)(*pauVar7 + 0x14) = auVar25._20_4_ + auVar15._20_4_;
      *(float *)(*pauVar7 + 0x18) = auVar25._24_4_ + auVar15._24_4_;
      *(float *)(*pauVar7 + 0x1c) = auVar25._28_4_ + auVar15._28_4_;
      pauVar7 = pauVar7 + 1;
      lVar10 = lVar10 + 8;
    }
    for (; iVar9 + 3 < iVar8; iVar9 = iVar9 + 4) {
      auVar13._8_4_ = 0x80000000;
      auVar13._0_8_ = 0x8000000080000000;
      auVar13._12_4_ = 0x80000000;
      auVar18 = vorps_avx(*(undefined1 (*) [16])*pauVar7,auVar13);
      auVar19._8_4_ = 0x42b0c0a5;
      auVar19._0_8_ = 0x42b0c0a542b0c0a5;
      auVar19._12_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx(auVar18,auVar19);
      auVar20._8_4_ = 0xc2b0c0a5;
      auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar20._12_4_ = 0xc2b0c0a5;
      auVar4 = vmaxps_avx(auVar18,auVar20);
      auVar46._8_4_ = 0x3f000000;
      auVar46._0_8_ = 0x3f0000003f000000;
      auVar46._12_4_ = 0x3f000000;
      auVar21._0_4_ = auVar4._0_4_ * 1.442695 + 0.5;
      auVar21._4_4_ = auVar4._4_4_ * 1.442695 + 0.5;
      auVar21._8_4_ = auVar4._8_4_ * 1.442695 + 0.5;
      auVar21._12_4_ = auVar4._12_4_ * 1.442695 + 0.5;
      auVar39._0_4_ = (int)auVar21._0_4_;
      auVar39._4_4_ = (int)auVar21._4_4_;
      auVar39._8_4_ = (int)auVar21._8_4_;
      auVar39._12_4_ = (int)auVar21._12_4_;
      auVar38 = vcvtdq2ps_avx(auVar39);
      auVar18 = vcmpps_avx(auVar21,auVar38,1);
      auVar18 = vandps_avx(auVar42,auVar18);
      auVar18 = vsubps_avx(auVar38,auVar18);
      auVar40._0_4_ = auVar18._0_4_ * 0.6931472;
      auVar40._4_4_ = auVar18._4_4_ * 0.6931472;
      auVar40._8_4_ = auVar18._8_4_ * 0.6931472;
      auVar40._12_4_ = auVar18._12_4_ * 0.6931472;
      auVar38 = vsubps_avx(auVar4,auVar40);
      fVar17 = auVar38._0_4_;
      fVar32 = auVar38._4_4_;
      fVar33 = auVar38._8_4_;
      fVar34 = auVar38._12_4_;
      auVar22._0_4_ = (int)auVar18._0_4_;
      auVar22._4_4_ = (int)auVar18._4_4_;
      auVar22._8_4_ = (int)auVar18._8_4_;
      auVar22._12_4_ = (int)auVar18._12_4_;
      auVar18 = vpslld_avx(auVar22,0x17);
      auVar18 = vpaddd_avx(auVar42,auVar18);
      auVar14._0_4_ =
           auVar50._0_4_ +
           (auVar50._0_4_ + fVar17 +
           fVar17 * fVar17 *
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar18._0_4_;
      auVar14._4_4_ =
           auVar50._4_4_ +
           (auVar50._4_4_ + fVar32 +
           fVar32 * fVar32 *
           (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
             0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5)) * auVar18._4_4_;
      auVar14._8_4_ =
           auVar50._8_4_ +
           (auVar50._8_4_ + fVar33 +
           fVar33 * fVar33 *
           (((((fVar33 * 0.00019875691 + 0.0013981999) * fVar33 + 0.008333452) * fVar33 +
             0.041665796) * fVar33 + 0.16666666) * fVar33 + 0.5)) * auVar18._8_4_;
      auVar14._12_4_ =
           auVar50._12_4_ +
           (auVar50._12_4_ + fVar34 +
           fVar34 * fVar34 *
           (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
             0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar18._12_4_;
      auVar23._8_4_ = 0x800000;
      auVar23._0_8_ = 0x80000000800000;
      auVar23._12_4_ = 0x800000;
      auVar18 = vmaxps_avx(auVar14,auVar23);
      auVar38 = vpsrld_avx(auVar18,0x17);
      auVar43._8_4_ = 0xffffff82;
      auVar43._0_8_ = 0xffffff82ffffff82;
      auVar43._12_4_ = 0xffffff82;
      auVar38 = vpaddd_avx(auVar38,auVar43);
      auVar44._8_4_ = 0x807fffff;
      auVar44._0_8_ = 0x807fffff807fffff;
      auVar44._12_4_ = 0x807fffff;
      auVar18 = vandps_avx(auVar18,auVar44);
      auVar13 = vorps_avx(auVar18,auVar46);
      auVar4 = vcvtdq2ps_avx(auVar38);
      auVar45._8_4_ = 0x3f3504f3;
      auVar45._0_8_ = 0x3f3504f33f3504f3;
      auVar45._12_4_ = 0x3f3504f3;
      auVar38 = vcmpps_avx(auVar13,auVar45,1);
      auVar18 = vandps_avx(auVar38,auVar13);
      fVar17 = auVar13._0_4_ + -1.0 + auVar18._0_4_;
      fVar32 = auVar13._4_4_ + -1.0 + auVar18._4_4_;
      fVar33 = auVar13._8_4_ + -1.0 + auVar18._8_4_;
      fVar34 = auVar13._12_4_ + -1.0 + auVar18._12_4_;
      auVar18 = vandps_avx(auVar42,auVar38);
      auVar18 = vsubps_avx(auVar4,auVar18);
      auVar24._0_4_ =
           auVar18._0_4_ * 0.6931472 + fVar17 +
           fVar17 * fVar17 *
           (((((((((fVar17 * 0.070376836 + -0.1151461) * fVar17 + 0.116769984) * fVar17 +
                 -0.12420141) * fVar17 + 0.14249323) * fVar17 + -0.16668057) * fVar17 + 0.20000714)
              * fVar17 + -0.24999994) * fVar17 + 0.3333333) * fVar17 + -0.5);
      auVar24._4_4_ =
           auVar18._4_4_ * 0.6931472 + fVar32 +
           fVar32 * fVar32 *
           (((((((((fVar32 * 0.070376836 + -0.1151461) * fVar32 + 0.116769984) * fVar32 +
                 -0.12420141) * fVar32 + 0.14249323) * fVar32 + -0.16668057) * fVar32 + 0.20000714)
              * fVar32 + -0.24999994) * fVar32 + 0.3333333) * fVar32 + -0.5);
      auVar24._8_4_ =
           auVar18._8_4_ * 0.6931472 + fVar33 +
           fVar33 * fVar33 *
           (((((((((fVar33 * 0.070376836 + -0.1151461) * fVar33 + 0.116769984) * fVar33 +
                 -0.12420141) * fVar33 + 0.14249323) * fVar33 + -0.16668057) * fVar33 + 0.20000714)
              * fVar33 + -0.24999994) * fVar33 + 0.3333333) * fVar33 + -0.5);
      auVar24._12_4_ =
           auVar18._12_4_ * 0.6931472 + fVar34 +
           fVar34 * fVar34 *
           (((((((((fVar34 * 0.070376836 + -0.1151461) * fVar34 + 0.116769984) * fVar34 +
                 -0.12420141) * fVar34 + 0.14249323) * fVar34 + -0.16668057) * fVar34 + 0.20000714)
              * fVar34 + -0.24999994) * fVar34 + 0.3333333) * fVar34 + -0.5);
      auVar4._12_4_ = 0;
      auVar4._0_12_ = ZEXT412(0);
      auVar18 = vcmpps_avx(auVar14,auVar4 << 0x20,2);
      auVar38 = vorps_avx(auVar18,auVar24);
      auVar18 = vmaxps_avx(*(undefined1 (*) [16])*pauVar7,auVar4 << 0x20);
      *(float *)*pauVar7 = auVar38._0_4_ + auVar18._0_4_;
      *(float *)(*pauVar7 + 4) = auVar38._4_4_ + auVar18._4_4_;
      *(float *)(*pauVar7 + 8) = auVar38._8_4_ + auVar18._8_4_;
      *(float *)(*pauVar7 + 0xc) = auVar38._12_4_ + auVar18._12_4_;
      pauVar7 = (undefined1 (*) [32])(*pauVar7 + 0x10);
      lVar10 = lVar10 + 4;
    }
    lVar6 = sVar3 * sVar2 * uVar12;
    for (; (int)lVar10 < iVar8; lVar10 = lVar10 + 1) {
      fVar17 = *(float *)((long)pvVar1 + lVar10 * 4 + lVar6);
      if (fVar17 <= 0.0) {
        fVar17 = expf(fVar17);
        fVar32 = logf(fVar17 + 1.0);
      }
      else {
        fVar32 = expf(-fVar17);
        fVar32 = logf(fVar32 + 1.0);
        fVar32 = fVar32 + fVar17;
      }
      *(float *)((long)pvVar1 + lVar10 * 4 + lVar6) = fVar32;
      auVar50 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    }
  }
  return 0;
}

Assistant:

int BNLL_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = *ptr + logf(1.f + expf(-(*ptr)));
            else
                *ptr = logf(1.f + expf(*ptr));
            ptr++;
        }
    }
    return 0;
}